

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

string * __thiscall
flatbuffers::ts::TsGenerator::GenStructMemberValueTS
          (string *__return_storage_ptr__,TsGenerator *this,StructDef *struct_def,string *prefix,
          string *delimiter,bool nullCheck)

{
  IdlNamer *pIVar1;
  BaseType BVar2;
  FieldDef *pFVar3;
  StructDef *struct_def_00;
  bool bVar4;
  pointer ppFVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> curr_member_accessor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string nullValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ppFVar5 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pIVar1 = &this->namer_;
  do {
    if (ppFVar5 ==
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      return __return_storage_ptr__;
    }
    pFVar3 = *ppFVar5;
    std::operator+(&nullValue,prefix,".");
    (*(pIVar1->super_Namer)._vptr_Namer[4])(&local_b0,pIVar1,pFVar3);
    std::operator+(&curr_member_accessor,&nullValue,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&nullValue);
    bVar4 = std::operator!=(prefix,"this");
    if (bVar4) {
      std::operator+(&local_b0,prefix,"?.");
      (*(pIVar1->super_Namer)._vptr_Namer[4])(&local_d0,pIVar1,pFVar3);
      std::operator+(&nullValue,&local_b0,&local_d0);
      std::__cxx11::string::operator=((string *)&curr_member_accessor,(string *)&nullValue);
      std::__cxx11::string::~string((string *)&nullValue);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    if (((pFVar3->value).type.base_type == BASE_TYPE_STRUCT) &&
       (struct_def_00 = (pFVar3->value).type.struct_def, struct_def_00->fixed == true)) {
      GenStructMemberValueTS(&nullValue,this,struct_def_00,&curr_member_accessor,delimiter,true);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_001d3102:
      std::__cxx11::string::~string((string *)&nullValue);
    }
    else {
      if (nullCheck) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&nullValue,"0",(allocator<char> *)&local_b0);
        BVar2 = (pFVar3->value).type.base_type;
        if (((BVar2 - BASE_TYPE_LONG < 2) || (BVar2 == BASE_TYPE_ARRAY)) ||
           (BVar2 == BASE_TYPE_BOOL)) {
          std::__cxx11::string::assign((char *)&nullValue);
        }
        std::operator+(&local_70,"(",&curr_member_accessor);
        std::operator+(&local_50,&local_70," ?? ");
        std::operator+(&local_d0,&local_50,&nullValue);
        std::operator+(&local_b0,&local_d0,")");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        goto LAB_001d3102;
      }
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    ppFVar5 = ppFVar5 + 1;
    if (ppFVar5 !=
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&curr_member_accessor);
  } while( true );
}

Assistant:

std::string GenStructMemberValueTS(const StructDef &struct_def,
                                     const std::string &prefix,
                                     const std::string &delimiter,
                                     const bool nullCheck = true) {
    std::string ret;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;

      auto curr_member_accessor = prefix + "." + namer_.Method(field);
      if (prefix != "this") {
        curr_member_accessor = prefix + "?." + namer_.Method(field);
      }
      if (IsStruct(field.value.type)) {
        ret += GenStructMemberValueTS(*field.value.type.struct_def,
                                      curr_member_accessor, delimiter);
      } else {
        if (nullCheck) {
          std::string nullValue = "0";
          if (field.value.type.base_type == BASE_TYPE_BOOL) {
            nullValue = "false";
          } else if (field.value.type.base_type == BASE_TYPE_LONG ||
                     field.value.type.base_type == BASE_TYPE_ULONG) {
            nullValue = "BigInt(0)";
          } else if (field.value.type.base_type == BASE_TYPE_ARRAY) {
            nullValue = "[]";
          }
          ret += "(" + curr_member_accessor + " ?? " + nullValue + ")";
        } else {
          ret += curr_member_accessor;
        }
      }

      if (std::next(it) != struct_def.fields.vec.end()) { ret += delimiter; }
    }

    return ret;
  }